

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_mount.c
# Opt level: O1

LY_ERR lyplg_ext_schema_mount_get_parent_ref(lysc_ext_instance *ext,ly_set **refs)

{
  LY_ERR LVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  bool bVar5;
  bool bVar6;
  ly_bool ext_data_free;
  ly_set *snode_set;
  ly_set *results_set;
  ly_set *pref_set;
  char *value;
  lyd_node *ext_data;
  ly_err_item *err;
  ly_bool local_69;
  ly_set *local_68;
  ly_set *local_60;
  ly_set *local_58;
  char *local_50;
  ly_set **local_48;
  lyd_node *local_40;
  ly_err_item *local_38;
  
  local_58 = (ly_set *)0x0;
  local_68 = (ly_set *)0x0;
  local_60 = (ly_set *)0x0;
  LVar1 = lyplg_ext_get_data(ext->module->ctx,ext,&local_40,&local_69);
  if (LVar1 == LY_SUCCESS) {
    LVar1 = schema_mount_get_parent_ref(ext,local_40,&local_58);
    if (LVar1 == LY_SUCCESS) {
      if (local_58->count == 0) {
        LVar1 = LY_SUCCESS;
      }
      else {
        LVar1 = ly_set_new(&local_60);
        if (LVar1 == LY_SUCCESS) {
          iVar4 = 3;
          if (local_58->count == 0) {
            LVar1 = LY_SUCCESS;
          }
          else {
            uVar3 = 0;
            do {
              LVar1 = lyplg_type_print_xpath10_value
                                ((lyd_value_xpath10 *)(local_58->field_2).dnodes[uVar3][1].parent,
                                 LY_VALUE_JSON,(void *)0x0,&local_50,&local_38);
              iVar4 = 2;
              if (LVar1 == LY_SUCCESS) {
                LVar1 = lys_find_xpath(ext->module->ctx,(lysc_node *)0x0,local_50,0,&local_68);
                free(local_50);
                if (LVar1 == LY_SUCCESS) {
                  bVar6 = local_68->count == 0;
                  bVar5 = !bVar6;
                  if (bVar6) {
                    iVar4 = 6;
                    LVar1 = LY_SUCCESS;
                  }
                  else {
                    LVar1 = ly_set_add(local_60,*(local_68->field_2).objs,'\0',(uint32_t *)0x0);
                    iVar4 = 2;
                    if (LVar1 == LY_SUCCESS) {
                      uVar2 = 1;
                      local_48 = refs;
                      do {
                        bVar5 = uVar2 < local_68->count;
                        if (!bVar5) {
                          iVar4 = 6;
                          refs = local_48;
                          LVar1 = LY_SUCCESS;
                          break;
                        }
                        LVar1 = ly_set_add(local_60,(local_68->field_2).dnodes[uVar2],'\0',
                                           (uint32_t *)0x0);
                        uVar2 = uVar2 + 1;
                        refs = local_48;
                      } while (LVar1 == LY_SUCCESS);
                    }
                  }
                  if (!bVar5) {
                    iVar4 = 0;
                    ly_set_free(local_68,(_func_void_void_ptr *)0x0);
                    local_68 = (ly_set *)0x0;
                  }
                }
              }
              if (iVar4 != 0) goto LAB_001a2725;
              uVar3 = uVar3 + 1;
            } while (uVar3 < local_58->count);
            iVar4 = 3;
          }
LAB_001a2725:
          if (iVar4 != 2) {
            if (iVar4 != 3) {
              return LVar1;
            }
            *refs = local_60;
          }
        }
      }
    }
    if (LVar1 != LY_SUCCESS) {
      ly_set_free(local_60,(_func_void_void_ptr *)0x0);
    }
    ly_set_free(local_68,(_func_void_void_ptr *)0x0);
    if (local_69 != '\0') {
      lyd_free_all(local_40);
    }
    ly_set_free(local_58,(_func_void_void_ptr *)0x0);
  }
  return LVar1;
}

Assistant:

LY_ERR
lyplg_ext_schema_mount_get_parent_ref(const struct lysc_ext_instance *ext, struct ly_set **refs)
{
    LY_ERR rc;
    struct ly_set *pref_set = NULL;
    struct ly_set *snode_set = NULL;
    struct ly_set *results_set = NULL;
    struct lyd_node *ext_data;
    ly_bool ext_data_free;

    /* get operational data with ietf-yang-library and ietf-yang-schema-mount data */
    if ((rc = lyplg_ext_get_data(ext->module->ctx, ext, (void **)&ext_data, &ext_data_free))) {
        return rc;
    }

    LY_CHECK_GOTO(rc = schema_mount_get_parent_ref(ext, ext_data, &pref_set), cleanup);
    if (pref_set->count == 0) {
        goto cleanup;
    }

    LY_CHECK_GOTO(rc = ly_set_new(&results_set), cleanup);

    for (uint32_t i = 0; i < pref_set->count; ++i) {
        struct lyd_node_term *term;
        struct lyd_value_xpath10 *xp_val;
        char *value;
        struct ly_err_item *err;

        term = (struct lyd_node_term *)pref_set->dnodes[i];
        LYD_VALUE_GET(&term->value, xp_val);
        LY_CHECK_GOTO(rc = lyplg_type_print_xpath10_value(xp_val, LY_VALUE_JSON, NULL, &value, &err), cleanup);
        LY_CHECK_ERR_GOTO(rc = lys_find_xpath(ext->module->ctx, NULL, value, 0, &snode_set), free(value), cleanup);
        free(value);
        for (uint32_t sn = 0; sn < snode_set->count; sn++) {
            LY_CHECK_GOTO(rc = ly_set_add(results_set, snode_set->snodes[sn], 0, NULL), cleanup);
        }
        ly_set_free(snode_set, NULL);
        snode_set = NULL;
    }

    *refs = results_set;

cleanup:
    if (rc) {
        ly_set_free(results_set, NULL);
    }
    ly_set_free(snode_set, NULL);
    if (ext_data_free) {
        lyd_free_all(ext_data);
    }
    ly_set_free(pref_set, NULL);

    return rc;
}